

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VListNameToNum(VList *pIn,char *zName,int nName)

{
  int iVar1;
  int iVar2;
  char *z;
  int local_28;
  int mx;
  int i;
  int nName_local;
  char *zName_local;
  VList *pIn_local;
  
  if (pIn != (VList *)0x0) {
    iVar1 = pIn[1];
    local_28 = 2;
    do {
      iVar2 = strncmp((char *)(pIn + (local_28 + 2)),zName,(long)nName);
      if ((iVar2 == 0) && (*(char *)((long)(pIn + (local_28 + 2)) + (long)nName) == '\0')) {
        return pIn[local_28];
      }
      local_28 = pIn[local_28 + 1] + local_28;
    } while (local_28 < iVar1);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VListNameToNum(VList *pIn, const char *zName, int nName){
  int i, mx;
  if( pIn==0 ) return 0;
  mx = pIn[1];
  i = 2;
  do{
    const char *z = (const char*)&pIn[i+2];
    if( strncmp(z,zName,nName)==0 && z[nName]==0 ) return pIn[i];
    i += pIn[i+1];
  }while( i<mx );
  return 0;
}